

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SanityCheckPass.h
# Opt level: O0

void soul::SanityCheckPass::expectSilentCastPossible
               (Context *context,ArrayView<soul::Type> targetTypes,Expression *source)

{
  bool bVar1;
  byte bVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  undefined1 in_R8B;
  ArrayView<soul::Type> types;
  ArrayView<soul::Type> types_00;
  string local_180;
  string local_160;
  CompileMessage local_140;
  Context *local_108;
  Type *pTStack_100;
  string local_f0;
  string local_d0;
  CompileMessage local_b0;
  undefined4 local_78;
  Type *local_68;
  Type *type;
  Type *__end2;
  Type *__begin2;
  ArrayView<soul::Type> *__range2;
  undefined1 local_40 [4];
  int matches;
  Type sourceType;
  Expression *source_local;
  Context *context_local;
  ArrayView<soul::Type> targetTypes_local;
  
  targetTypes_local.s = targetTypes.e;
  context_local = (Context *)targetTypes.s;
  sourceType.structure.object = (Structure *)source;
  (*(source->super_Statement).super_ASTObject._vptr_ASTObject[4])(local_40);
  __range2._4_4_ = 0;
  __begin2 = (Type *)&context_local;
  __end2 = ArrayView<soul::Type>::begin((ArrayView<soul::Type> *)__begin2);
  type = ArrayView<soul::Type>::end((ArrayView<soul::Type> *)__begin2);
  do {
    if (__end2 == type) {
      if (__range2._4_4_ == 0) {
        Type::getDescription_abi_cxx11_(&local_d0,(Type *)local_40);
        local_108 = context_local;
        pTStack_100 = targetTypes_local.s;
        pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        types.e = (Type *)0x0;
        types.s = targetTypes_local.s;
        heart::Utilities::getDescriptionOfTypeList_abi_cxx11_
                  (&local_f0,(Utilities *)context_local,types,(bool)in_R8B);
        Errors::cannotImplicitlyCastType<std::__cxx11::string,std::__cxx11::string>
                  (&local_b0,(Errors *)&local_d0,&local_f0,pbVar3);
        AST::Context::throwError(context,&local_b0,false);
      }
      if (1 < __range2._4_4_) {
        Type::getDescription_abi_cxx11_(&local_160,(Type *)local_40);
        pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        types_00.e = (Type *)0x0;
        types_00.s = targetTypes_local.s;
        heart::Utilities::getDescriptionOfTypeList_abi_cxx11_
                  (&local_180,(Utilities *)context_local,types_00,(bool)in_R8B);
        Errors::ambiguousCastBetween<std::__cxx11::string,std::__cxx11::string>
                  (&local_140,(Errors *)&local_160,&local_180,pbVar3);
        AST::Context::throwError(context,&local_140,false);
      }
      local_78 = 0;
LAB_0046870b:
      Type::~Type((Type *)local_40);
      return;
    }
    local_68 = __end2;
    bVar1 = Type::isEqual((Type *)local_40,__end2,4);
    if (bVar1) {
      local_78 = 1;
      goto LAB_0046870b;
    }
    bVar2 = (**(code **)(*(long *)sourceType.structure.object + 0x80))
                      (sourceType.structure.object,local_68);
    if ((bVar2 & 1) != 0) {
      __range2._4_4_ = __range2._4_4_ + 1;
    }
    __end2 = __end2 + 1;
  } while( true );
}

Assistant:

static void expectSilentCastPossible (const AST::Context& context, ArrayView<Type> targetTypes, AST::Expression& source)
    {
        auto sourceType = source.getResultType();

        int matches = 0;

        for (auto& type : targetTypes)
        {
            // If we have an exact match, it doesn't matter how many other types could be used silently
            if (sourceType.isEqual (type, Type::ignoreVectorSize1))
                return;

            if (source.canSilentlyCastTo (type))
                ++matches;
        }

        if (matches == 0)
            context.throwError (Errors::cannotImplicitlyCastType (sourceType.getDescription(),
                                                                  heart::Utilities::getDescriptionOfTypeList (targetTypes, false)));

        if (matches > 1)
            context.throwError (Errors::ambiguousCastBetween (sourceType.getDescription(),
                                                              heart::Utilities::getDescriptionOfTypeList (targetTypes, false)));
    }